

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::PixelStatsAccumulator::ReportCounter
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t val)

{
  Image *this_00;
  PixelStats *pPVar1;
  Tuple2<pbrt::Point2,_int> resolution;
  Allocator alloc;
  ulong uVar2;
  pointer pIVar3;
  Point2i p_00;
  Float FVar4;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_181;
  int64_t local_180;
  WrapMode2D local_178;
  ColorEncodingHandle local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Image local_148;
  
  pPVar1 = this->stats;
  uVar2 = (ulong)statIndex;
  pIVar3 = (pPVar1->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_180 = val;
  if ((ulong)(((long)(pPVar1->counterImages).
                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pIVar3) / 0x118) <= uVar2) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pPVar1->counterImages,(long)(statIndex + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->counterNames,(long)(statIndex + 1));
    std::__cxx11::string::assign
              ((char *)((this->stats->counterNames).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar2));
    pIVar3 = (this->stats->counterImages).
             super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this_00 = pIVar3 + uVar2;
  resolution = (Tuple2<pbrt::Point2,_int>)Bounds2<int>::Diagonal((Bounds2<int> *)imageBounds);
  if (pIVar3[uVar2].resolution.super_Tuple2<pbrt::Point2,_int> != resolution) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"count",&local_181);
    local_170.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = &local_168;
    Image::Image(&local_148,Float,(Point2i)resolution,channels,&local_170,alloc);
    Image::operator=(this_00,&local_148);
    Image::~Image(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x =
       (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds._0_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.y =
       (p->super_Tuple2<pbrt::Point2,_int>).y - imageBounds._4_4_;
  WrapMode2D::WrapMode2D(&local_178,Clamp);
  FVar4 = Image::GetChannel(this_00,p_00,0,local_178);
  Image::SetChannel(this_00,p_00,0,FVar4 + (float)local_180);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportCounter(const Point2i &p, int statIndex,
                                          const char *name, int64_t val) {
    if (statIndex >= stats->counterImages.size()) {
        stats->counterImages.resize(statIndex + 1);
        stats->counterNames.resize(statIndex + 1);
        stats->counterNames[statIndex] = name;
    }

    Image &im = stats->counterImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"count"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + val);
}